

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> * __thiscall
Memory::HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
CreateHeapBlock(HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                *this,Recycler *recycler)

{
  BOOL BVar1;
  SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *heapBlock;
  Recycler *recycler_local;
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  *this_local;
  
  this_local = (HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                *)GetUnusedHeapBlock(this);
  if ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)this_local ==
      (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    this_local = (HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                  *)0x0;
  }
  else {
    BVar1 = SmallHeapBlockT<MediumAllocationBlockAttributes>::ReassignPages
                      ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)this_local,recycler);
    if (BVar1 == 0) {
      FreeHeapBlock(this,(SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)
                         this_local);
      this_local = (HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                    *)0x0;
    }
    else {
      HeapInfo::
      AppendNewHeapBlock<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
                ((this->super_HeapBucket).heapInfo,
                 (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)this_local,
                 this);
      InterlockedIncrement<unsigned_int>(&(this->super_HeapBucket).newHeapBlockCount);
    }
  }
  return (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)this_local;
}

Assistant:

TBlockType *
HeapBucketT<TBlockType>::CreateHeapBlock(Recycler * recycler)
{
    FAULTINJECT_MEMORY_NOTHROW(_u("HeapBlock"), sizeof(TBlockType));

    // Add a new heap block
    TBlockType * heapBlock = GetUnusedHeapBlock();
    if (heapBlock == nullptr)
    {
        return nullptr;
    }

    if (!heapBlock->ReassignPages(recycler))
    {
        FreeHeapBlock(heapBlock);
        return nullptr;
    }

    // Add it to head of heap block list so we will keep track of the block
    this->heapInfo->AppendNewHeapBlock(heapBlock, this);
#if defined(RECYCLER_SLOW_CHECK_ENABLED) || ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
#if ENABLE_CONCURRENT_GC
    ::InterlockedIncrement(&this->newHeapBlockCount);
#else
    this->heapBlockCount++;
#endif
#endif
    return heapBlock;
}